

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_keypair_xonly_pub
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pubkey,int *pk_parity,
              secp256k1_keypair *keypair)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_ge pk;
  
  if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubkey != NULL";
  }
  else {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (keypair != (secp256k1_keypair *)0x0) {
      iVar1 = secp256k1_keypair_load(ctx,(secp256k1_scalar *)0x0,&pk,keypair);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_extrakeys_ge_even_y(&pk);
      if (pk_parity != (int *)0x0) {
        *pk_parity = iVar1;
      }
      secp256k1_pubkey_save((secp256k1_pubkey_conflict *)pubkey,&pk);
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "keypair != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_keypair_xonly_pub(const secp256k1_context* ctx, secp256k1_xonly_pubkey *pubkey, int *pk_parity, const secp256k1_keypair *keypair) {
    secp256k1_ge pk;
    int tmp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(keypair != NULL);

    if (!secp256k1_keypair_load(ctx, NULL, &pk, keypair)) {
        return 0;
    }
    tmp = secp256k1_extrakeys_ge_even_y(&pk);
    if (pk_parity != NULL) {
        *pk_parity = tmp;
    }
    secp256k1_xonly_pubkey_save(pubkey, &pk);

    return 1;
}